

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafmode.c
# Opt level: O0

parser_error parse_graf_directory(parser *p)

{
  void *pvVar1;
  char *leaf;
  char *dir;
  graphics_mode *mode;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  leaf = parser_getsym(p,"dirname");
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    path_build((char *)((long)pvVar1 + 0x10),0x100,ANGBAND_DIR_TILES,leaf);
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_graf_directory(struct parser *p) {
	graphics_mode *mode = parser_priv(p);
	const char *dir = parser_getsym(p, "dirname");
	if (!mode) {
		return PARSE_ERROR_INVALID_VALUE;
	}

	/* Build a usable path */
	path_build(mode->path, sizeof(mode->path), ANGBAND_DIR_TILES, dir);

	return PARSE_ERROR_NONE;
}